

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O3

bool google::protobuf::io::ReadHexDigits(char *ptr,int len,uint32 *result)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  uint32 uVar4;
  int iVar5;
  
  *result = 0;
  if (len == 0) {
    return false;
  }
  if (0 < len) {
    pcVar3 = ptr + len;
    uVar4 = 0;
    do {
      cVar1 = *ptr;
      iVar5 = (int)cVar1;
      bVar2 = cVar1 != '\0';
      if (cVar1 == '\0') {
        return bVar2;
      }
      if ((byte)(cVar1 - 0x30U) < 10) {
        iVar5 = iVar5 + -0x30;
      }
      else if ((byte)(cVar1 + 0x9fU) < 0x1a) {
        iVar5 = iVar5 + -0x57;
      }
      else {
        iVar5 = iVar5 + -0x37;
        if (0x19 < (byte)(cVar1 + 0xbfU)) {
          iVar5 = -1;
        }
      }
      uVar4 = uVar4 * 0x10 + iVar5;
      *result = uVar4;
      ptr = ptr + 1;
    } while (ptr < pcVar3);
    return bVar2;
  }
  return true;
}

Assistant:

static bool ReadHexDigits(const char* ptr, int len, uint32* result) {
  *result = 0;
  if (len == 0) return false;
  for (const char* end = ptr + len; ptr < end; ++ptr) {
    if (*ptr == '\0') return false;
    *result = (*result << 4) + DigitValue(*ptr);
  }
  return true;
}